

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cc
# Opt level: O3

size_t xemmai::anon_unknown_18::f_expand(void ***a_pc,t_pvalue *a_stack,size_t a_n)

{
  void **ppvVar1;
  t_object *ptVar2;
  t_pvalue *ptVar3;
  void *pvVar4;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 aVar5;
  t_object *p;
  void **ppvVar6;
  long lVar7;
  wchar_t *extraout_RDX;
  wchar_t *extraout_RDX_00;
  void *pvVar8;
  void ***pppvVar9;
  ulong uVar10;
  void *pvVar11;
  long in_FS_OFFSET;
  undefined1 auVar12 [16];
  wstring_view a_message;
  wstring_view a_message_00;
  wstring_view a_message_01;
  wstring_view a_message_02;
  void *local_60;
  t_pvalue *local_58;
  pthread_rwlock_t *local_50;
  t_pvalue local_48;
  
  if (a_stack == (t_pvalue *)0x0) {
LAB_00155a0b:
    __assert_fail("a_n > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/shin1m[P]xemmai/src/code.cc"
                  ,0x1a,
                  "size_t xemmai::(anonymous namespace)::f_expand(void **&, t_pvalue *, size_t)");
  }
  pppvVar9 = a_pc + (long)a_stack * 2 + 2;
  ppvVar1 = *pppvVar9;
  local_48.super_t_pointer.v_p = (t_object *)*pppvVar9;
  local_48.field_0 =
       *(anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 *)(a_pc + (long)a_stack * 2 + 3);
  if ((void **)0x4 < ppvVar1) {
    pvVar11 = ppvVar1[8];
    if (*(long *)((long)pvVar11 + 8) != 0) {
      if (*(undefined8 **)(*(wchar_t **)((long)pvVar11 + 0x10) + 2) == &v__type_id<xemmai::t_tuple>)
      {
        pvVar11 = ppvVar1[9];
        if (*(void ****)(in_FS_OFFSET + -0x30) < pppvVar9 + (long)pvVar11 * 2) {
          *(void ****)(in_FS_OFFSET + -0x30) = pppvVar9 + (long)pvVar11 * 2;
        }
        if (pvVar11 == (void *)0x0) {
          pvVar11 = (void *)0x0;
        }
        else {
          lVar7 = 0;
          pvVar8 = pvVar11;
          do {
            *(undefined8 *)((long)a_pc + lVar7 + (long)a_stack * 0x10 + 0x10) =
                 *(undefined8 *)((long)ppvVar1 + lVar7 + 0x50);
            *(undefined8 *)((long)a_pc + lVar7 + (long)a_stack * 0x10 + 0x18) =
                 *(undefined8 *)((long)ppvVar1 + lVar7 + 0x58);
            lVar7 = lVar7 + 0x10;
            pvVar8 = (void *)((long)pvVar8 + -1);
          } while (pvVar8 != (void *)0x0);
        }
        goto LAB_001557f2;
      }
      if ((*(long *)((long)pvVar11 + 8) != 1) &&
         (*(undefined8 **)(*(long *)((long)pvVar11 + 0x10) + 0x10) == &v__type_id<xemmai::t_list>))
      {
        local_58 = a_stack;
        if (ppvVar1[9] == *(void **)(in_FS_OFFSET + -0x68)) {
          pvVar11 = ppvVar1[0x13];
          if (*(void ****)(in_FS_OFFSET + -0x30) < pppvVar9 + (long)pvVar11 * 2) {
            *(void ****)(in_FS_OFFSET + -0x30) = pppvVar9 + (long)pvVar11 * 2;
          }
          if (pvVar11 == (void *)0x0) {
            pvVar11 = (void *)0x0;
          }
          else {
            pppvVar9 = a_pc + (long)a_stack * 2 + 3;
            pvVar8 = (void *)0x0;
            do {
              local_60 = pvVar8;
              t_list::f_validate((t_list *)(ppvVar1 + 9),(intptr_t *)&local_60);
              pvVar4 = ppvVar1[0x11];
              uVar10 = 0;
              if (*(ulong *)((long)pvVar4 + 0x48) <= (ulong)((long)ppvVar1[0x12] + (long)local_60))
              {
                uVar10 = *(ulong *)((long)pvVar4 + 0x48);
              }
              lVar7 = (((long)ppvVar1[0x12] + (long)local_60) - uVar10) * 0x10;
              pppvVar9[-1] = *(void ***)((long)pvVar4 + lVar7 + 0x50);
              *pppvVar9 = *(void ***)((long)pvVar4 + lVar7 + 0x58);
              pvVar8 = (void *)((long)pvVar8 + 1);
              pppvVar9 = pppvVar9 + 2;
              a_stack = local_58;
            } while (pvVar11 != pvVar8);
          }
        }
        else {
          if (ppvVar1[9] != (void *)0x0) {
            a_message_01._M_str = *(wchar_t **)((long)pvVar11 + 0x10);
            a_message_01._M_len = (size_t)L"owned by another thread.";
            f_throw((xemmai *)0x18,a_message_01);
          }
          local_50 = (pthread_rwlock_t *)(ppvVar1 + 10);
          std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&local_50->__data);
          if (ppvVar1[9] != (void *)0x0) {
            a_message_02._M_str = extraout_RDX_00;
            a_message_02._M_len = (size_t)L"owned by another thread.";
            f_throw((xemmai *)0x18,a_message_02);
          }
          pvVar11 = ppvVar1[0x13];
          if (*(void ****)(in_FS_OFFSET + -0x30) < pppvVar9 + (long)pvVar11 * 2) {
            *(void ****)(in_FS_OFFSET + -0x30) = pppvVar9 + (long)pvVar11 * 2;
          }
          if (pvVar11 != (void *)0x0) {
            pppvVar9 = a_pc + (long)a_stack * 2 + 3;
            pvVar8 = (void *)0x0;
            do {
              local_60 = pvVar8;
              t_list::f_validate((t_list *)(ppvVar1 + 9),(intptr_t *)&local_60);
              pvVar4 = ppvVar1[0x11];
              uVar10 = 0;
              if (*(ulong *)((long)pvVar4 + 0x48) <= (ulong)((long)ppvVar1[0x12] + (long)local_60))
              {
                uVar10 = *(ulong *)((long)pvVar4 + 0x48);
              }
              lVar7 = (((long)ppvVar1[0x12] + (long)local_60) - uVar10) * 0x10;
              pppvVar9[-1] = *(void ***)((long)pvVar4 + lVar7 + 0x50);
              *pppvVar9 = *(void ***)((long)pvVar4 + lVar7 + 0x58);
              pvVar8 = (void *)((long)pvVar8 + 1);
              pppvVar9 = pppvVar9 + 2;
            } while (pvVar11 != pvVar8);
          }
          pthread_rwlock_unlock(local_50);
          a_stack = local_58;
        }
        goto LAB_001557f2;
      }
    }
  }
  lVar7 = *(long *)(in_FS_OFFSET + -0x78);
  ptVar2 = *(t_object **)(lVar7 + 0x2e0);
  ptVar3 = *(t_pvalue **)(in_FS_OFFSET + -0x30);
  *(t_pvalue **)(in_FS_OFFSET + -0x30) = ptVar3 + 2;
  ptVar3[1].super_t_pointer.v_p = (t_object *)0x0;
  ppvVar6 = (void **)(lVar7 + 0x10 + (long)ppvVar1 * 8);
  if ((void **)0x4 < ppvVar1) {
    ppvVar6 = ppvVar1 + 8;
  }
  t_type_of<xemmai::t_object>::f_invoke
            ((t_type_of<xemmai::t_object> *)*ppvVar6,&local_48,ptVar2,&f_expand::index,ptVar3,0);
  ptVar2 = (ptVar3->super_t_pointer).v_p;
  pvVar11 = (void *)(ptVar3->field_0).v_integer;
  *(t_pvalue **)(in_FS_OFFSET + -0x30) = ptVar3;
  a_message._M_str = extraout_RDX;
  if (ptVar2 != (t_object *)0x3) {
    if ((((ptVar2 < (t_object *)0x3) || (ptVar2 == (t_object *)0x4)) ||
        (ptVar2->v_type->v_depth == 0)) ||
       (a_message._M_str = (wchar_t *)&v__type_id<long>,
       (undefined8 *)ptVar2->v_type->v_ids[1] != &v__type_id<long>)) {
      _GLOBAL__N_1::f_expand();
      goto LAB_00155a0b;
    }
    if ((t_object *)0x4 < ptVar2) {
      pvVar11 = *(void **)ptVar2->v_data;
    }
  }
  if (ptVar3 < (t_pvalue *)(pppvVar9 + (long)pvVar11 * 2)) {
    *(t_pvalue **)(in_FS_OFFSET + -0x30) = (t_pvalue *)(pppvVar9 + (long)pvVar11 * 2);
  }
  if (pvVar11 == (void *)0x0) {
    pvVar11 = (void *)0x0;
  }
  else {
    pvVar8 = (void *)0x0;
    do {
      if (local_48.super_t_pointer.v_p < (t_object *)0x5) {
        a_message_00._M_str = a_message._M_str;
        a_message_00._M_len = (size_t)L"not supported.";
        f_throw((xemmai *)0xe,a_message_00);
      }
      ptVar3 = *(t_pvalue **)(in_FS_OFFSET + -0x30);
      *(t_pvalue **)(in_FS_OFFSET + -0x30) = ptVar3 + 3;
      ptVar3[2].super_t_pointer.v_p = (t_object *)0x3;
      ptVar3[2].field_0.v_integer = (intptr_t)pvVar8;
      auVar12 = (undefined1  [16])
                (*(local_48.super_t_pointer.v_p)->v_type->f_get_at)
                          (local_48.super_t_pointer.v_p,ptVar3);
      while( true ) {
        a_message._M_str = auVar12._8_8_;
        if (auVar12._0_8_ == 0xffffffffffffffff) break;
        ptVar2 = (ptVar3->super_t_pointer).v_p;
        if (ptVar2 < (t_object *)0x5) {
          a_message._M_len = (size_t)L"not supported.";
          f_throw((xemmai *)0xe,a_message);
        }
        auVar12 = (undefined1  [16])(*ptVar2->v_type->f_call)(ptVar2,ptVar3,auVar12._0_8_);
      }
      ptVar2 = (ptVar3->super_t_pointer).v_p;
      aVar5 = ptVar3->field_0;
      *(t_pvalue **)(in_FS_OFFSET + -0x30) = ptVar3;
      pppvVar9[(long)pvVar8 * 2] = &ptVar2->v_next;
      *(anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 *)(pppvVar9 + (long)pvVar8 * 2 + 1)
           = aVar5;
      pvVar8 = (void *)((long)pvVar8 + 1);
    } while (pvVar8 != pvVar11);
  }
LAB_001557f2:
  return (size_t)((long)pvVar11 + (long)((long)&a_stack[-1].field_0 + 7));
}

Assistant:

size_t f_expand(void**& a_pc, t_pvalue* a_stack, size_t a_n)
{
	assert(a_n > 0);
	a_stack += a_n + 1;
	auto x = a_stack[0];
	size_t n;
	if (f_is<t_tuple>(x)) {
		auto& tuple = x->f_as<t_tuple>();
		n = tuple.f_size();
		f_allocate(a_stack, n);
		for (size_t i = 0; i < n; ++i) a_stack[i] = tuple[i];
	} else if (f_is<t_list>(x)) {
		auto& list = x->f_as<t_list>();
		list.f_owned_or_shared<std::shared_lock>([&]
		{
			n = list.f_size();
			f_allocate(a_stack, n);
			for (size_t i = 0; i < n; ++i) a_stack[i] = list[i];
		});
	} else {
		static size_t index;
		auto size = x.f_invoke(f_global()->f_symbol_size(), index);
		f_check<size_t>(size, L"size");
		n = f_as<size_t>(size);
		f_allocate(a_stack, n);
		for (size_t i = 0; i < n; ++i) a_stack[i] = x.f_get_at(i);
	}
	return a_n - 1 + n;
}